

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_tun.c
# Opt level: O0

int csp_if_tun_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  int iVar1;
  csp_packet_t *pcVar2;
  undefined4 in_ECX;
  csp_packet_t *in_RDX;
  long in_RDI;
  int length;
  csp_packet_t *new_packet;
  csp_if_tun_conf_t *ifconf;
  csp_packet_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint *pxTaskWoken;
  undefined4 in_stack_ffffffffffffffd8;
  
  pxTaskWoken = *(uint **)(in_RDI + 0x18);
  pcVar2 = csp_buffer_get_always();
  if (pcVar2 == (csp_packet_t *)0x0) {
    csp_buffer_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if ((uint)(in_RDX->id).dst == *pxTaskWoken) {
    csp_id_setup_rx(in_stack_ffffffffffffffb8);
    iVar1 = csp_crypto_decrypt((in_RDX->field_5).data,(uint8_t)in_RDX->length,
                               (pcVar2->field_0).field_1.frame_begin);
    if (iVar1 < 0) {
      csp_buffer_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      csp_buffer_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
    }
    else {
      (pcVar2->field_0).field_1.frame_length = (uint16_t)iVar1;
      csp_buffer_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
      csp_id_strip(in_stack_ffffffffffffffb8);
      csp_qfifo_write(in_RDX,(csp_iface_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),pxTaskWoken);
    }
  }
  else {
    csp_id_prepend((csp_packet_t *)0x112a84);
    (pcVar2->id).dst = (uint16_t)pxTaskWoken[1];
    (pcVar2->id).src = (uint16_t)*pxTaskWoken;
    (pcVar2->id).sport = '\0';
    (pcVar2->id).dport = '\0';
    (pcVar2->id).pri = (in_RDX->id).pri;
    pcVar2->length = (in_RDX->field_0).field_1.frame_length;
    iVar1 = csp_crypto_encrypt((in_RDX->field_0).field_1.frame_begin,
                               (uint8_t)(in_RDX->field_0).field_1.frame_length,
                               (pcVar2->field_5).data);
    pcVar2->length = (uint16_t)iVar1;
    csp_buffer_free((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    csp_id_prepend((csp_packet_t *)0x112b22);
    csp_qfifo_write(in_RDX,(csp_iface_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),pxTaskWoken);
  }
  return 0;
}

Assistant:

static int csp_if_tun_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_if_tun_conf_t * ifconf = iface->driver_data;

	/* Allocate new frame */
	csp_packet_t * new_packet = csp_buffer_get_always();
	if (new_packet == NULL) {
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	if (packet->id.dst == ifconf->tun_src) {

		/**
		 * Incomming tunnel packet
		 */
		//csp_hex_dump("incoming packet", packet->data, packet->length);

		csp_id_setup_rx(new_packet);

#if 1
		int length = csp_crypto_decrypt(packet->data, packet->length, new_packet->frame_begin);
		if (length < 0) {
			csp_buffer_free(new_packet);
			csp_buffer_free(packet);
			iface->rx_error++;
			return CSP_ERR_NONE;
		} else {
			new_packet->frame_length = length;
		}
#else
		/* Decapsulate */
		memcpy(new_packet->frame_begin, packet->data, packet->length);
		new_packet->frame_length = packet->length;
#endif

		/* Now free old packet */
		csp_buffer_free(packet);

		//csp_hex_dump("new frame", new_packet->frame_begin, new_packet->frame_length + 16);

		csp_id_strip(new_packet);

		//csp_hex_dump("new packet", new_packet->data, new_packet->length);

		/* Send new packet */
		csp_qfifo_write(new_packet, iface, NULL);

	} else {

		/**
		 * Outgoing tunnel packet
		 */

		//csp_hex_dump("packet", packet->data, packet->length);

		/* Apply CSP header */
		csp_id_prepend(packet);

		//csp_hex_dump("frame", packet->frame_begin, packet->frame_length);

		/* Create tunnel header */
		new_packet->id.dst = ifconf->tun_dst;
		new_packet->id.src = ifconf->tun_src;
		new_packet->id.sport = 0;
		new_packet->id.dport = 0;
		new_packet->id.pri = packet->id.pri;
		new_packet->length = packet->frame_length;

#if 1
		/* Encrypt */
		new_packet->length = csp_crypto_encrypt(packet->frame_begin, packet->frame_length, new_packet->data);
#else
		/* Encapsulate */
		memcpy(new_packet->data, packet->frame_begin, packet->frame_length);
#endif

		/* Free old packet */
		csp_buffer_free(packet);

		//csp_hex_dump("new packet", new_packet->data, new_packet->length);

		/* Apply CSP header */
		csp_id_prepend(new_packet);

		//csp_hex_dump("new frame", new_packet->frame_begin, new_packet->frame_length);

		/* Send new packet */
		csp_qfifo_write(new_packet, iface, NULL);

	}

	return CSP_ERR_NONE;

}